

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

void fillcolliding(lua_State *L,context *ctx)

{
  node *pnVar1;
  ulong uVar2;
  int iVar3;
  node *local_48;
  node *n;
  node *mainpos;
  uint32_t keyhash;
  int keytype;
  int key;
  int i;
  int emptyslot;
  int sizehash;
  table *tbl;
  context *ctx_local;
  lua_State *L_local;
  
  _emptyslot = ctx->tbl;
  i = _emptyslot->sizehash;
  key = 0;
  tbl = (table *)ctx;
  ctx_local = (context *)L;
  lua_pushnil(L);
  do {
    iVar3 = lua_next((lua_State *)ctx_local,1);
    if (iVar3 == 0) {
      return;
    }
    iVar3 = ishashkey((context *)tbl,(lua_State *)ctx_local,-2,(int *)&keyhash,(uint32_t *)&mainpos,
                      (int *)((long)&mainpos + 4));
    if ((iVar3 != 0) &&
       ((pnVar1 = _emptyslot->hash, uVar2 = (ulong)(uint)mainpos % (ulong)(uint)_emptyslot->sizehash
        , pnVar1[uVar2].keytype != mainpos._4_4_ || (pnVar1[uVar2].key != keyhash)))) {
      local_48 = (node *)0x0;
      for (keytype = key; keytype < i; keytype = keytype + 1) {
        if (_emptyslot->hash[keytype].valuetype == '\0') {
          local_48 = _emptyslot->hash + keytype;
          break;
        }
      }
      if (local_48 == (node *)0x0) {
        __assert_fail("n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-sharedata.c"
                      ,0x103,"void fillcolliding(lua_State *, struct context *)");
      }
      local_48->next = pnVar1[uVar2].next;
      pnVar1[uVar2].next = (int)(((long)local_48 - (long)_emptyslot->hash) / 0x18);
      pnVar1[uVar2].nocolliding = '\0';
      local_48->key = keyhash;
      local_48->keytype = (uint8_t)mainpos._4_4_;
      local_48->keyhash = (uint)mainpos;
      local_48->nocolliding = '\0';
      setvalue((context *)tbl,(lua_State *)ctx_local,-1,local_48);
    }
    lua_settop((lua_State *)ctx_local,-2);
  } while( true );
}

Assistant:

static void
fillcolliding(lua_State *L, struct context *ctx) {
	struct table * tbl = ctx->tbl;
	int sizehash = tbl->sizehash;
	int emptyslot = 0;
	int i;
	lua_pushnil(L);
	while (lua_next(L, 1) != 0) {
		int key;
		int keytype;
		uint32_t keyhash;
		if (ishashkey(ctx, L, -2, &key, &keyhash, &keytype)) {
			struct node * mainpos = &tbl->hash[keyhash % tbl->sizehash];
			if (!(mainpos->keytype == keytype && mainpos->key == key)) {
				// the key has not insert
				struct node * n = NULL;
				for (i=emptyslot;i<sizehash;i++) {
					if (tbl->hash[i].valuetype == VALUETYPE_NIL) {
						n = &tbl->hash[i];
						break;
					}
				}
				assert(n);
				n->next = mainpos->next;
				mainpos->next = n - tbl->hash;
				mainpos->nocolliding = 0;
				n->key = key;
				n->keytype = keytype;
				n->keyhash = keyhash;
				n->nocolliding = 0;
				setvalue(ctx, L, -1, n);	// set n->v , n->valuetype
			}
		}
		lua_pop(L,1);
	}
}